

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Client_call(UA_Client *client,UA_NodeId objectId,UA_NodeId methodId,size_t inputSize,
              UA_Variant *input,size_t *outputSize,UA_Variant **output)

{
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 *local_110;
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  size_t local_d8;
  UA_Variant *local_d0;
  undefined1 local_c8 [8];
  UA_CallResponse response;
  
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_110 = local_108;
  local_f0._16_8_ = methodId.identifier.string.data;
  local_f0._0_2_ = methodId.namespaceIndex;
  local_f0._2_2_ = methodId._2_2_;
  local_f0._4_4_ = methodId.identifierType;
  local_f0._8_8_ = methodId.identifier.string.length;
  local_108._0_2_ = objectId.namespaceIndex;
  local_108._2_2_ = objectId._2_2_;
  local_108._4_4_ = objectId.identifierType;
  local_108._8_8_ = objectId.identifier.string.length;
  local_108._16_8_ = objectId.identifier.string.data;
  local_118 = 1;
  local_d8 = inputSize;
  local_d0 = input;
  __UA_Client_Service(client,&local_188,UA_TYPES + 0x30,local_c8,UA_TYPES + 0x7f);
  if ((response.responseHeader.timestamp._4_4_ == 0) &&
     (response.responseHeader.timestamp._4_4_ = 0x80010000,
     response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1)) {
    response.responseHeader.timestamp._4_4_ = *(UA_StatusCode *)response.resultsSize;
    if (*(UA_StatusCode *)response.resultsSize == 0) {
      response.responseHeader.timestamp._4_4_ = 0;
      if (outputSize != (size_t *)0x0 && output != (UA_Variant **)0x0) {
        *output = *(UA_Variant **)(response.resultsSize + 0x30);
        *outputSize = *(size_t *)(response.resultsSize + 0x28);
        *(undefined8 *)(response.resultsSize + 0x28) = 0;
        *(undefined8 *)(response.resultsSize + 0x30) = 0;
        response.responseHeader.timestamp._4_4_ = 0;
      }
    }
  }
  UA_CallResponse_deleteMembers((UA_CallResponse *)local_c8);
  return response.responseHeader.timestamp._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_call(UA_Client *client, const UA_NodeId objectId,
               const UA_NodeId methodId, size_t inputSize,
               const UA_Variant *input, size_t *outputSize,
               UA_Variant **output) {
    /* Set up the request */
    UA_CallRequest request;
    UA_CallRequest_init(&request);
    UA_CallMethodRequest item;
    UA_CallMethodRequest_init(&item);
    item.methodId = methodId;
    item.objectId = objectId;
    item.inputArguments = (void*)(uintptr_t)input; // cast const...
    item.inputArgumentsSize = inputSize;
    request.methodsToCall = &item;
    request.methodsToCallSize = 1;

    /* Call the service */
    UA_CallResponse response = UA_Client_Service_call(client, request);
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD) {
        if(response.resultsSize == 1)
            retval = response.results[0].statusCode;
        else
            retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
    }
    if(retval != UA_STATUSCODE_GOOD) {
        UA_CallResponse_deleteMembers(&response);
        return retval;
    }

    /* Move the output arguments */
    if(output != NULL && outputSize != NULL) {
        *output = response.results[0].outputArguments;
        *outputSize = response.results[0].outputArgumentsSize;
        response.results[0].outputArguments = NULL;
        response.results[0].outputArgumentsSize = 0;
    }
    UA_CallResponse_deleteMembers(&response);
    return retval;
}